

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleTable::focusChild(QAccessibleTable *this)

{
  int iVar1;
  QAbstractItemView *this_00;
  QAccessibleInterface *pQVar2;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QAbstractItemView *)view(this);
  QAbstractItemView::currentIndex((QModelIndex *)&local_38,this_00);
  pQVar2 = (QAccessibleInterface *)0x0;
  if (((-1 < (int)local_38) && (-1 < (long)local_38)) && (local_28.ptr != (QAbstractItemModel *)0x0)
     ) {
    iVar1 = logicalIndex(this,(QModelIndex *)&local_38);
    pQVar2 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x100))(this,iVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::focusChild() const
{
    QModelIndex index = view()->currentIndex();
    if (!index.isValid())
        return nullptr;

    return child(logicalIndex(index));
}